

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5DecodeRowidList(int *pRc,Fts5Buffer *pBuf,u8 *pData,int nData)

{
  byte bVar1;
  int iVar2;
  u64 local_40;
  u64 iVal;
  char *zApp;
  i64 iRowid;
  int i;
  int nData_local;
  u8 *pData_local;
  Fts5Buffer *pBuf_local;
  int *pRc_local;
  
  iRowid._0_4_ = 0;
  zApp = (char *)0x0;
  iRowid._4_4_ = nData;
  _i = pData;
  pData_local = (u8 *)pBuf;
  pBuf_local = (Fts5Buffer *)pRc;
  while ((int)iRowid < iRowid._4_4_) {
    iVal = (long)"*** in database %s ***\n" + 0x17;
    bVar1 = sqlite3Fts5GetVarint(_i + (int)iRowid,&local_40);
    iVar2 = (uint)bVar1 + (int)iRowid;
    zApp = zApp + local_40;
    iRowid._0_4_ = iVar2;
    if ((iVar2 < iRowid._4_4_) && (_i[iVar2] == '\0')) {
      iRowid._0_4_ = iVar2 + 1;
      if (((int)iRowid < iRowid._4_4_) && (_i[(int)iRowid] == '\0')) {
        iRowid._0_4_ = iVar2 + 2;
        iVal = (u64)anon_var_dwarf_1b855;
      }
      else {
        iVal = (long)"L*" + 1;
      }
    }
    sqlite3Fts5BufferAppendPrintf((int *)pBuf_local,(Fts5Buffer *)pData_local," %lld%s",zApp,iVal);
  }
  return;
}

Assistant:

static void fts5DecodeRowidList(
  int *pRc,                       /* IN/OUT: Error code */
  Fts5Buffer *pBuf,               /* Buffer to append text to */
  const u8 *pData, int nData      /* Data to decode list-of-rowids from */
){
  int i = 0;
  i64 iRowid = 0;

  while( i<nData ){
    const char *zApp = "";
    u64 iVal;
    i += sqlite3Fts5GetVarint(&pData[i], &iVal);
    iRowid += iVal;

    if( i<nData && pData[i]==0x00 ){
      i++;
      if( i<nData && pData[i]==0x00 ){
        i++;
        zApp = "+";
      }else{
        zApp = "*";
      }
    }

    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " %lld%s", iRowid, zApp);
  }
}